

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool use_powerline_left;
  bool use_powerline_right;
  bool segments_to_left;
  bool use_vert_graph;
  bool segments_to_right;
  int iVar2;
  uint uVar3;
  long *plVar4;
  ostream *poVar5;
  bool use_colors;
  long lVar6;
  char *pcVar7;
  int local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  MEMORY_MODE local_d0;
  CPU_MODE local_cc;
  short local_c0;
  string local_98;
  string local_78;
  MemoryStatus memory_status;
  string local_50;
  
  uVar3 = 0;
  local_e0 = 10;
  local_d4 = 3;
  local_dc = 990000;
  local_d8 = 0;
  use_powerline_left = false;
  use_powerline_right = false;
  use_vert_graph = false;
  segments_to_left = false;
  segments_to_right = false;
  local_d0 = MEMORY_MODE_DEFAULT;
  local_cc = CPU_MODE_DEFAULT;
  bVar1 = false;
switchD_00102bf0_caseD_63:
  use_colors = bVar1;
  iVar2 = getopt_long(argc,argv,"hi:cpqvl:r:g:m:a:t:",main::long_options,0);
  bVar1 = true;
  switch(iVar2) {
  case 0x61:
    local_d4 = atoi(_optarg);
    bVar1 = use_colors;
    if (local_d4 < 4) goto switchD_00102bf0_caseD_63;
    pcVar7 = "Valid averages-count arguments are: 0, 1, 2, 3\n";
    lVar6 = 0x2f;
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x73:
  case 0x75:
    goto switchD_00102bf0_caseD_62;
  case 99:
    goto switchD_00102bf0_caseD_63;
  case 0x67:
    local_e0 = atoi(_optarg);
    bVar1 = use_colors;
    if (local_e0 < 0) {
      pcVar7 = "Graph lines argument must be zero or greater.\n";
      goto LAB_00102df7;
    }
    goto switchD_00102bf0_caseD_63;
  case 0x68:
    goto LAB_00102e51;
  case 0x69:
    iVar2 = atoi(_optarg);
    if (0 < iVar2) {
      local_dc = iVar2 * 1000000 - 10000;
      bVar1 = use_colors;
      goto switchD_00102bf0_caseD_63;
    }
    pcVar7 = "Status interval argument must be one or greater.\n";
    lVar6 = 0x31;
    break;
  case 0x6c:
    uVar3 = atoi(_optarg);
    if (0xff < uVar3) goto LAB_00102dfe;
    segments_to_left = true;
    bVar1 = use_colors;
    goto switchD_00102bf0_caseD_63;
  case 0x6d:
    local_d0 = atoi(_optarg);
    bVar1 = use_colors;
    if (-1 < (int)local_d0) goto switchD_00102bf0_caseD_63;
    pcVar7 = "Memory mode argument must be zero or greater.\n";
LAB_00102df7:
    lVar6 = 0x2e;
    break;
  case 0x70:
    use_powerline_left = true;
    bVar1 = true;
    goto switchD_00102bf0_caseD_63;
  case 0x71:
    use_powerline_right = true;
    bVar1 = true;
    goto switchD_00102bf0_caseD_63;
  case 0x72:
    local_d8 = atoi(_optarg);
    if (local_d8 < 0x100) {
      segments_to_right = true;
      bVar1 = use_colors;
      goto switchD_00102bf0_caseD_63;
    }
LAB_00102dfe:
    pcVar7 = "Valid color vaues are from 0 to 255.\n";
    lVar6 = 0x25;
    break;
  case 0x74:
    local_cc = atoi(_optarg);
    bVar1 = use_colors;
    if (-1 < (int)local_cc) goto switchD_00102bf0_caseD_63;
    pcVar7 = "CPU mode argument must be zero or greater.\n";
    lVar6 = 0x2b;
    break;
  case 0x76:
    goto switchD_00102bf0_caseD_76;
  default:
    if (iVar2 == -1) {
      if (argc <= _optind) {
        mem_status(&memory_status);
        local_c0 = (short)uVar3;
        mem_string_abi_cxx11_
                  (&local_50,&memory_status,local_d0,use_colors,use_powerline_left,
                   use_powerline_right,segments_to_left,local_c0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        cpu_string_abi_cxx11_
                  (&local_78,local_cc,local_dc,(int)(short)local_e0,use_colors,use_powerline_left,
                   use_powerline_right,use_vert_graph);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
        load_string_abi_cxx11_
                  (&local_98,use_colors,use_powerline_left,use_powerline_right,(short)local_d4,
                   segments_to_right,(short)local_d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_98._M_dataplus._M_p,local_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "The interval and graph lines options are now specified with flags.\n\n",0x44);
LAB_00102e51:
      print_help();
      return 1;
    }
    if (iVar2 == 0x3f) {
      return 1;
    }
    goto switchD_00102bf0_caseD_62;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
  return 1;
switchD_00102bf0_caseD_76:
  use_vert_graph = true;
  bVar1 = use_colors;
  goto switchD_00102bf0_caseD_63;
switchD_00102bf0_caseD_62:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"?? getopt returned character code 0 ",0x24);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return 1;
}

Assistant:

int main( int argc, char** argv )
{
  unsigned cpu_usage_delay = 990000;
  short averages_count = 3;
  short graph_lines = 10; // max 32767 should be enough
  short left_color = 0;
  short right_color = 0;
  bool use_colors = false;
  bool use_powerline_left = false;
  bool use_powerline_right = false;
  bool use_vert_graph = false;
  bool segments_to_left = false;
  bool segments_to_right= false;
  MEMORY_MODE mem_mode = MEMORY_MODE_DEFAULT;
  CPU_MODE cpu_mode = CPU_MODE_DEFAULT;

  static struct option long_options[] =
  {
    // Struct is a s follows:
    //   const char * name, int has_arg, int *flag, int val
    // if *flag is null, val is option identifier to use in switch()
    // otherwise it's a value to set the variable *flag points to
    { "help", no_argument, NULL, 'h' },
    { "colors", no_argument, NULL, 'c' },
    { "powerline-left", no_argument, NULL, 'p' },
    { "powerline-right", no_argument, NULL, 'q' },
    { "vertical-graph", no_argument, NULL, 'v' },
    { "interval", required_argument, NULL, 'i' },
    { "graph-lines", required_argument, NULL, 'g' },
    { "mem-mode", required_argument, NULL, 'm' },
    { "cpu-mode", required_argument, NULL, 't' },
    { "averages-count", required_argument, NULL, 'a' },
    { "segments-left", required_argument, NULL, 'l' },
    { "segments-right", required_argument, NULL, 'r' },
    { 0, 0, 0, 0 } // used to handle unknown long options
  };

  int c;
  // while c != -1
  while( (c = getopt_long( argc, argv, "hi:cpqvl:r:g:m:a:t:", long_options, NULL) ) != -1 )
  {
    switch( c )
    {
      case 'h': // --help, -h
        print_help();
        return EXIT_FAILURE;
        break;
      case 'c': // --colors
        use_colors = true;
        break;
      case 'p': // --powerline-left
        use_colors = true;
        use_powerline_left = true;
        break;
      case 'q': // --powerline-right
        use_colors = true;
        use_powerline_right = true;
        break;
      case 'v': // --vertical-graph
        use_vert_graph = true;
        break;
      case 'l': // --segments-left
        segments_to_left = true;
        if( atoi( optarg ) < 0 || atoi( optarg ) > 255 )
        {
          std::cerr << "Valid color vaues are from 0 to 255.\n";
          return EXIT_FAILURE;
        }
        left_color = atoi( optarg ) ;
        break;
      case 'r': // --segments-right
        segments_to_right= true;
        if( atoi( optarg ) < 0 || atoi( optarg ) > 255 )
        {
          std::cerr << "Valid color vaues are from 0 to 255.\n";
          return EXIT_FAILURE;
        }
        right_color = atoi( optarg ) ;
        break;
      case 'i': // --interval, -i
        if( atoi( optarg ) < 1 )
          {
            std::cerr << "Status interval argument must be one or greater.\n";
            return EXIT_FAILURE;
          }
        cpu_usage_delay = atoi( optarg ) * 1000000 - 10000;
        break;
      case 'g': // --graph-lines, -g
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "Graph lines argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        graph_lines = atoi( optarg );
        break;
      case 'm': // --mem-mode, -m
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "Memory mode argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        mem_mode = static_cast< MEMORY_MODE >( atoi( optarg ) );
        break;
      case 't': // --cpu-mode, -t
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "CPU mode argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        cpu_mode = static_cast< CPU_MODE >( atoi( optarg ) );
        break;
      case 'a': // --averages-count, -a
        if( atoi( optarg ) < 0 || atoi( optarg ) > 3 )
          {
            std::cerr << "Valid averages-count arguments are: 0, 1, 2, 3\n";
            return EXIT_FAILURE;
          }
        averages_count = atoi( optarg );
        break;
      case '?':
        // getopt_long prints error message automatically
        return EXIT_FAILURE;
        break;
      default:
        std::cerr << "?? getopt returned character code 0 " << c << std::endl;
        return EXIT_FAILURE;
    }
  }
  // Detect old option specification and return and error message.
  if( argc > optind )
  {
    std::cout <<
      "The interval and graph lines options are now specified with flags.\n\n";
    print_help();
    return EXIT_FAILURE;
  }

  MemoryStatus memory_status;
  mem_status( memory_status );
  std::cout << mem_string( memory_status, mem_mode, use_colors, use_powerline_left, use_powerline_right, segments_to_left, left_color )
    << cpu_string( cpu_mode, cpu_usage_delay, graph_lines, use_colors, use_powerline_left, use_powerline_right, use_vert_graph )
    << load_string( use_colors, use_powerline_left, use_powerline_right, averages_count, segments_to_right, right_color );

  std::cout << std::endl;

  return EXIT_SUCCESS;
}